

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O3

_Bool intersect_ray_tri(ray *ray,hit *hit,tri *tri)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar2 = *(undefined8 *)(tri->p0)._;
  uVar3 = *(undefined8 *)(ray->org)._;
  fVar4 = (float)uVar2 - (float)uVar3;
  fVar5 = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20);
  uVar2 = *(undefined8 *)(ray->dir)._;
  fVar6 = (tri->p0)._[2] - (ray->org)._[2];
  fVar9 = (ray->dir)._[2];
  fVar11 = (float)uVar2;
  fVar13 = (float)((ulong)uVar2 >> 0x20);
  fVar10 = fVar13 * fVar6 - fVar9 * fVar5;
  fVar12 = fVar9 * fVar4 - fVar6 * fVar11;
  fVar14 = fVar11 * fVar5 - fVar4 * fVar13;
  uVar2 = *(undefined8 *)(tri->n)._;
  fVar1 = (tri->n)._[2];
  fVar7 = (float)uVar2;
  fVar8 = (float)((ulong)uVar2 >> 0x20);
  fVar9 = 1.0 / (fVar11 * fVar7 + fVar13 * fVar8 + fVar9 * fVar1);
  uVar2 = *(undefined8 *)(tri->e2)._;
  uVar3 = *(undefined8 *)(tri->e1)._;
  fVar11 = fVar9 * ((float)uVar2 * fVar10 +
                   (float)((ulong)uVar2 >> 0x20) * fVar12 + (tri->e2)._[2] * fVar14);
  fVar10 = fVar9 * ((float)uVar3 * fVar10 +
                   (float)((ulong)uVar3 >> 0x20) * fVar12 + (tri->e1)._[2] * fVar14);
  if ((((0.0 <= fVar11) && (0.0 <= fVar10)) && (fVar10 + fVar11 <= 1.0)) &&
     ((fVar9 = (fVar7 * fVar4 + fVar8 * fVar5 + fVar6 * fVar1) * fVar9, ray->t_min <= fVar9 &&
      (fVar9 <= ray->t_max)))) {
    ray->t_max = fVar9;
    *(ulong *)(hit->uv)._ = CONCAT44(fVar10,fVar11);
    return true;
  }
  return false;
}

Assistant:

bool intersect_ray_tri(struct ray* ray, struct hit* hit, const struct tri* tri) {
    struct vec3 c = sub_vec3(tri->p0, ray->org);
    struct vec3 r = cross_vec3(ray->dir, c);

    real_t inv_det = ((real_t)1) / dot_vec3(tri->n, ray->dir);
    real_t u = dot_vec3(r, tri->e2) * inv_det;
    real_t v = dot_vec3(r, tri->e1) * inv_det;

    // These comparisons are designed to return false
    // when one of t, u, or v is a NaN
    if (u >= 0 && v >= 0 && u + v <= 1) {
        real_t t = dot_vec3(tri->n, c) * inv_det;
        if (t >= ray->t_min && t <= ray->t_max) {
            ray->t_max = t;
            hit->uv = make_vec2(u, v);
            return true;
        }
    }

    return false;
}